

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __thiscall
booster::locale::impl_posix::num_format<wchar_t>::write_it
          (num_format<wchar_t> *this,ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> out,
          char *ptr,size_t n)

{
  element_type *pp_Var1;
  char *end;
  ulong uVar2;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *this_00;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *in_RCX;
  undefined1 in_DL;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  long in_R8;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> oVar3;
  size_t i;
  wstring tmp;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff30;
  ulong uVar4;
  wchar_t __c;
  string *charset;
  allocator *begin;
  ulong local_a0;
  allocator local_81;
  string local_80 [32];
  wstring local_60 [56];
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_28;
  streambuf_type *local_18;
  undefined1 uStack_10;
  
  charset = (string *)((long)&in_RCX->_M_sbuf + in_R8);
  local_28._M_sbuf = in_RSI;
  local_28._M_failed = (bool)in_DL;
  pp_Var1 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(in_stack_ffffffffffffff30);
  end = nl_langinfo_l(0xe,(__locale_t)*pp_Var1);
  begin = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,end,begin);
  conv::to_utf<wchar_t>((char *)begin,end,charset,(method_type)((ulong)in_RCX >> 0x20));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_a0 = 0;
  while( true ) {
    uVar4 = local_a0;
    uVar2 = std::__cxx11::wstring::size();
    if (uVar2 <= uVar4) break;
    std::__cxx11::wstring::operator[]((ulong)local_60);
    __c = (wchar_t)(uVar4 >> 0x20);
    this_00 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++(&local_28,0)
    ;
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(this_00);
    std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=(in_RCX,__c);
    local_a0 = local_a0 + 1;
  }
  uStack_10 = local_28._M_failed;
  local_18 = local_28._M_sbuf;
  std::__cxx11::wstring::~wstring(local_60);
  oVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  oVar3._M_failed = (bool)uStack_10;
  oVar3._M_sbuf = local_18;
  return oVar3;
}

Assistant:

std::ostreambuf_iterator<wchar_t> write_it(std::ostreambuf_iterator<wchar_t> out,char const *ptr,size_t n) const
    {
        std::wstring tmp = conv::to_utf<wchar_t>(ptr,ptr+n,nl_langinfo_l(CODESET,*lc_));
        for(size_t i=0;i<tmp.size();i++)
            *out++ = tmp[i];
        return out;
    }